

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFinder.cpp
# Opt level: O1

void __thiscall Saturation::LabelFinder::onNewPropositionalClause(LabelFinder *this,Clause *cl)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  
  bVar3 = Kernel::MainLoop::isRefutation(cl);
  if (!bVar3) {
    bVar3 = Kernel::Clause::noSplits(cl);
    if (((bVar3) && ((*(uint *)&cl->field_0x38 & 0xffffe) == 0)) &&
       (uVar1 = (cl->_literals[0]->super_Term)._functor,
       (*(byte *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) + (ulong)uVar1 * 8) + 0x40) & 0x20) != 0)
       ) {
      if ((this->_foundLabels)._cursor == (this->_foundLabels)._end) {
        ::Lib::Stack<unsigned_int>::expand(&this->_foundLabels);
      }
      puVar2 = (this->_foundLabels)._cursor;
      *puVar2 = uVar1;
      (this->_foundLabels)._cursor = puVar2 + 1;
    }
  }
  return;
}

Assistant:

void LabelFinder::onNewPropositionalClause(Clause* cl)
{
  ASS(cl);
  // if we found a refutation ignore it
  if(Kernel::MainLoop::isRefutation(cl)) return;

  // Currently don't know what to do if conditional
  if(!cl->noSplits()) {
    return;
  }
  // Just looking for unit clauses
  if(cl->size() > 1){
    return;
  }

  unsigned predicate = (*cl)[0]->functor();

  // Looking for predicates
  ASS(env.signature->getPredicate(predicate));
  if(!env.signature->getPredicate(predicate)->label()){
    return;
  }

  _foundLabels.push(predicate);
}